

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O0

internals ** __thiscall pybind11::capsule::get_pointer<pybind11::detail::internals*>(capsule *this)

{
  char *pcVar1;
  internals **ppiVar2;
  error_already_set *this_00;
  internals **result;
  char *name;
  capsule *this_local;
  
  pcVar1 = capsule::name(this);
  ppiVar2 = (internals **)PyCapsule_GetPointer((this->super_object).super_handle.m_ptr,pcVar1);
  if (ppiVar2 == (internals **)0x0) {
    this_00 = (error_already_set *)__cxa_allocate_exception(0x18);
    error_already_set::error_already_set(this_00);
    __cxa_throw(this_00,&error_already_set::typeinfo,error_already_set::~error_already_set);
  }
  return ppiVar2;
}

Assistant:

T *get_pointer() const {
        const auto *name = this->name();
        T *result = static_cast<T *>(PyCapsule_GetPointer(m_ptr, name));
        if (!result) {
            throw error_already_set();
        }
        return result;
    }